

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O0

int ppc_hash32_pp_prot(int key,int pp,int nx)

{
  uint local_18;
  int prot;
  int nx_local;
  int pp_local;
  int key_local;
  
  if (key == 0) {
    if ((uint)pp < 3) {
      local_18 = 3;
    }
    else {
      if (pp != 3) {
        abort();
      }
      local_18 = 1;
    }
  }
  else {
    switch(pp) {
    case 0:
      local_18 = 0;
      break;
    case 1:
    case 3:
      local_18 = 1;
      break;
    case 2:
      local_18 = 3;
      break;
    default:
      abort();
    }
  }
  if (nx == 0) {
    local_18 = local_18 | 4;
  }
  return local_18;
}

Assistant:

static int ppc_hash32_pp_prot(int key, int pp, int nx)
{
    int prot;

    if (key == 0) {
        switch (pp) {
        case 0x0:
        case 0x1:
        case 0x2:
            prot = PAGE_READ | PAGE_WRITE;
            break;

        case 0x3:
            prot = PAGE_READ;
            break;

        default:
            abort();
        }
    } else {
        switch (pp) {
        case 0x0:
            prot = 0;
            break;

        case 0x1:
        case 0x3:
            prot = PAGE_READ;
            break;

        case 0x2:
            prot = PAGE_READ | PAGE_WRITE;
            break;

        default:
            abort();
        }
    }
    if (nx == 0) {
        prot |= PAGE_EXEC;
    }

    return prot;
}